

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

void leb__HeapWriteExplicit(leb_Heap *leb,leb_Node node,int32_t bitCount,uint32_t bitData)

{
  sbyte sVar1;
  byte bVar2;
  uint uVar3;
  int in_register_00000014;
  uint in_R8D;
  uint uVar4;
  uint uVar5;
  
  uVar5 = ((node.id - in_register_00000014) + 1) * bitCount +
          (2 << ((byte)in_register_00000014 & 0x1f));
  uVar3 = uVar5 >> 5;
  uVar5 = uVar5 & 0x1f;
  uVar4 = 0x20 - uVar5;
  if (bitData <= uVar4) {
    uVar4 = bitData;
  }
  sVar1 = (sbyte)uVar5;
  *(uint *)((long)&leb->buffer + (ulong)uVar3 * 4) =
       in_R8D << sVar1 |
       ~(~(-1 << ((byte)uVar4 & 0x1f)) << sVar1) & *(uint *)((long)&leb->buffer + (ulong)uVar3 * 4);
  if (bitData - uVar4 < 0x21) {
    uVar5 = ((uint)(1 << ((char)node.id + 2U & 0x1f)) >> 5) - 1;
    if (uVar3 + 1 < uVar5) {
      uVar5 = uVar3 + 1;
    }
    bVar2 = (byte)(bitData - uVar4);
    *(uint *)((long)&leb->buffer + (ulong)uVar5 * 4) =
         (*(uint *)((long)&leb->buffer + (ulong)uVar5 * 4) >> (bVar2 & 0x1f)) << (bVar2 & 0x1f) |
         in_R8D >> ((byte)uVar4 & 0x1f);
    return;
  }
  __assert_fail("bitOffset < 32u && bitCount <= 32u && bitOffset + bitCount <= 32u",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0xb4,"void leb__BitFieldInsert(uint32_t *, uint32_t, uint32_t, uint32_t)");
}

Assistant:

static void
leb__HeapWriteExplicit(
    leb_Heap *leb,
    const leb_Node node,
    int32_t bitCount,
    uint32_t bitData
) {
    leb__HeapArgs args = leb__CreateHeapArgs(leb, node, bitCount);

    leb__BitFieldInsert(args.bitFieldLSB,
                        args.bitOffsetLSB,
                        args.bitCountLSB,
                        bitData);
    leb__BitFieldInsert(args.bitFieldMSB,
                        0u,
                        args.bitCountMSB,
                        bitData >> args.bitCountLSB);
}